

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::loadVectors(FastText *this,string *filename)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  int32_t iVar5;
  int32_t iVar6;
  invalid_argument *piVar7;
  istream *this_00;
  ostream *poVar8;
  void *pvVar9;
  element_type *peVar10;
  long lVar11;
  element_type *peVar12;
  string *in_RSI;
  EVP_PKEY_CTX *ctx;
  float fVar13;
  size_t j_1;
  int32_t idx;
  size_t i_1;
  exception *e;
  int j;
  stringstream ss;
  string entry;
  string word;
  size_t i;
  string line;
  int64_t dim;
  int64_t n;
  shared_ptr<fasttext::Matrix> mat;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  ifstream in;
  shared_ptr<fasttext::Matrix> *in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff920;
  real in_stack_fffffffffffff924;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff928;
  Dictionary *in_stack_fffffffffffff930;
  long *in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff948;
  real in_stack_fffffffffffff94c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff950;
  Matrix *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff968;
  int in_stack_fffffffffffff96c;
  string *in_stack_fffffffffffff998;
  Dictionary *in_stack_fffffffffffff9a0;
  real *in_stack_fffffffffffff9c0;
  double in_stack_fffffffffffff9c8;
  Dictionary *in_stack_fffffffffffff9d0;
  ulong local_5b8;
  size_type local_5a8;
  undefined1 local_598 [32];
  string local_578 [36];
  int local_554;
  stringstream local_550 [392];
  string local_3c8 [32];
  string local_3a8 [32];
  ulong local_388;
  undefined1 local_369;
  string local_2c8 [32];
  string local_2a8 [39];
  undefined1 local_281;
  string local_280 [48];
  ulong local_250;
  ulong local_248 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  istream local_218 [536];
  
  std::ifstream::ifstream(local_218,in_RSI,_S_in);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x178d56);
  std::shared_ptr<fasttext::Matrix>::shared_ptr((shared_ptr<fasttext::Matrix> *)0x178d63);
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    local_281 = 1;
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                   (char *)in_stack_fffffffffffff940);
    std::invalid_argument::invalid_argument(piVar7,local_280);
    local_281 = 0;
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this_00 = (istream *)std::istream::operator>>(local_218,(long *)local_248);
  std::istream::operator>>(this_00,(long *)&local_250);
  std::__cxx11::string::string(local_2a8);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_218,local_2a8);
  poVar8 = std::operator<<((ostream *)&std::cerr,"Trying to load precomputed stuff ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_248[0]);
  poVar8 = std::operator<<(poVar8," ");
  pvVar9 = (void *)std::ostream::operator<<(poVar8,local_250);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  uVar2 = local_250;
  peVar10 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x178f7d);
  if (uVar2 == (long)peVar10->dim) {
    std::make_shared<fasttext::Matrix,long&,long&>
              ((long *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               in_stack_fffffffffffff940);
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)
               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               in_stack_fffffffffffff918);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x179204);
    for (local_388 = 0; local_388 < local_248[0]; local_388 = local_388 + 1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_218,local_2a8)
      ;
      lVar11 = std::__cxx11::string::size();
      if (lVar11 == 0) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"could not load ");
        poVar8 = std::operator<<(poVar8,local_2a8);
        pvVar9 = (void *)std::ostream::operator<<(poVar8,local_388);
        std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::__cxx11::string::string(local_3a8);
        std::__cxx11::string::string(local_3c8);
        _Var4 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_550,local_2a8,_Var4);
        for (local_554 = 0; iVar1 = local_554,
            peVar10 = std::
                      __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1792ca), iVar1 < peVar10->dim + 1; local_554 = local_554 + 1
            ) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_550,local_3c8,' ');
          if (local_554 == 0) {
            std::__cxx11::string::operator=(local_3a8,local_3c8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
            std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x17934b);
            Dictionary::add(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
          }
          else {
            in_stack_fffffffffffff9d0 = (Dictionary *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_578,(char *)in_stack_fffffffffffff9d0,(allocator *)(local_598 + 0x1f));
            in_stack_fffffffffffff9c8 =
                 std::__cxx11::stod((string *)
                                    CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                                    (size_t *)in_stack_fffffffffffff918);
            fVar13 = (float)in_stack_fffffffffffff9c8;
            std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x17941c);
            in_stack_fffffffffffff9c0 =
                 Matrix::at((Matrix *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                            (int64_t)in_stack_fffffffffffff918,0x179438);
            *in_stack_fffffffffffff9c0 = fVar13;
            std::__cxx11::string::~string(local_578);
            std::allocator<char>::~allocator((allocator<char> *)(local_598 + 0x1f));
          }
        }
        std::__cxx11::stringstream::~stringstream(local_550);
        std::__cxx11::string::~string(local_3c8);
        std::__cxx11::string::~string(local_3a8);
      }
    }
    std::ifstream::close();
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1796d7);
    ctx = (EVP_PKEY_CTX *)0x1;
    Dictionary::threshold
              (in_stack_fffffffffffff9d0,(int64_t)in_stack_fffffffffffff9c8,
               (int64_t)in_stack_fffffffffffff9c0);
    peVar12 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1796fb);
    Dictionary::init(peVar12,ctx);
    peVar12 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x179716);
    Dictionary::nwords(peVar12);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x179731);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x179754);
    std::make_shared<fasttext::Matrix,int,int&>
              ((int *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               (int *)in_stack_fffffffffffff940);
    this_01 = (Matrix *)local_598;
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)
               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               in_stack_fffffffffffff918);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x17979f);
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1797a9);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1797bb);
    Matrix::uniform(this_01,in_stack_fffffffffffff94c);
    for (local_5a8 = 0; local_5a8 < local_248[0]; local_5a8 = local_5a8 + 1) {
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x17980f);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_230,local_5a8);
      iVar5 = Dictionary::getId(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      if (-1 < iVar5) {
        peVar12 = std::
                  __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x17986d);
        iVar6 = Dictionary::nwords(peVar12);
        if (iVar5 < iVar6) {
          for (local_5b8 = 0; local_5b8 < local_250; local_5b8 = local_5b8 + 1) {
            std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1798bb);
            in_stack_fffffffffffff930 =
                 (Dictionary *)
                 Matrix::at((Matrix *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                            (int64_t)in_stack_fffffffffffff918,0x1798d3);
            in_stack_fffffffffffff924 =
                 *(real *)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&in_stack_fffffffffffff930->args_)->_M_impl).super__Vector_impl_data
                           ._M_start;
            std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1798fa);
            in_stack_fffffffffffff928 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Matrix::at((Matrix *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                            (int64_t)in_stack_fffffffffffff918,0x179912);
            *(real *)in_stack_fffffffffffff928 = in_stack_fffffffffffff924;
          }
        }
      }
    }
    std::__cxx11::string::~string(local_2a8);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x179976);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff930);
    std::ifstream::~ifstream(local_218);
    return;
  }
  local_369 = 1;
  piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  std::operator+((char *)in_stack_fffffffffffff928,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  std::operator+(in_stack_fffffffffffff928,
                 (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x17900f);
  std::__cxx11::to_string(in_stack_fffffffffffff96c);
  std::operator+(in_stack_fffffffffffff958,in_stack_fffffffffffff950);
  std::operator+(in_stack_fffffffffffff928,
                 (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  std::invalid_argument::invalid_argument(piVar7,local_2c8);
  local_369 = 0;
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::loadVectors(const std::string& filename) {
	std::ifstream in(filename);
	std::vector<std::string> words;
	std::shared_ptr<Matrix> mat; // temp. matrix for pretrained vectors
	int64_t n, dim;
	if (!in.is_open()) {
		throw std::invalid_argument(filename + " cannot be opened for loading!");
	}
	
	in >> n >> dim;
	std::string line;
	std::getline(in, line);
	std::cerr << "Trying to load precomputed stuff " << n << " " << dim << std::endl;
	if (dim != args_->dim) {
		throw std::invalid_argument(
				"Dimension of pretrained vectors (" + std::to_string(dim) +
				") does not match dimension (" + std::to_string(args_->dim) + ")!");
	}
	mat = std::make_shared<Matrix>(n, dim);
	for (size_t i = 0; i < n; i++) {
		std::getline(in, line);
		if(line.size()>0)
		{
			std::string word;
			std::string entry;
			std::stringstream ss(line);
			for(int j=0;j < args_->dim + 1; j++)
			{
				std::getline(ss, entry, ' ');
				if(j==0)
				{
					word = entry;
					words.push_back(word);
					dict_->add(word);
				}
				else
				{
					try
					{
						mat->at(i, j-1) = std::stod(entry.c_str());
					}
					catch(const std::exception& e)
					{
						std::cerr << "could not load "<< word << " " <<  entry << " " << i << std::endl;
					}
				}
			}
		}
		else
		{
			std::cerr << "could not load "<< line << i << std::endl;
		}
	}
	in.close();
	// std::cerr << dict_->nwords() << std::endl;
	dict_->threshold(1, 0);
	dict_->init();
	input_ =
			std::make_shared<Matrix>(dict_->nwords() + args_->bucket, args_->dim);
	input_->uniform(1.0 / args_->dim);

	for (size_t i = 0; i < n; i++) {
		int32_t idx = dict_->getId(words[i]);
		if (idx < 0 || idx >= dict_->nwords()) {
			continue;
		}
		for (size_t j = 0; j < dim; j++) {
			input_->at(idx, j) = mat->at(i, j);
		}
	}
}